

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O3

void __thiscall Code_generator::visit(Code_generator *this,Inst_branch *s)

{
  Expression *pEVar1;
  uint uVar2;
  int iVar3;
  iterator iVar4;
  ushort uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  string symbol;
  key_type local_f0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  uVar2 = s->condition - 0x147;
  uVar5 = 0;
  uVar7 = 0;
  if (uVar2 < 10) {
    uVar7 = (ushort)*(undefined4 *)(&DAT_0012fe40 + (ulong)uVar2 * 4);
  }
  iVar3 = (*s->expression->_vptr_Expression[3])();
  if ((char)iVar3 != '\0') {
    pEVar1 = s->expression;
    if (pEVar1->type == LABEL) {
      (*pEVar1->_vptr_Expression[4])(&local_d0,pEVar1);
      uVar2 = (s->super_Instruction).super_Statement.section_index;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_d0,local_d0 + local_c8);
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)ast::Symbols::table_abi_cxx11_,&local_f0);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar8 = (uint)((ulong)(DAT_0013da98 - ast::Sections::table) >> 3);
      }
      else {
        uVar8 = *(uint *)(*(long *)((long)iVar4.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
                                          ._M_cur + 0x28) + 0x3c);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      pEVar1 = s->expression;
      if (uVar2 == uVar8) {
        uVar2 = (uint)(ushort)pEVar1->value - (s->super_Instruction).super_Statement.section_offset;
        uVar6 = (ulong)(uVar2 - 2);
        if ((uVar2 & 1) != 0) {
          string_printf_abi_cxx11_(&local_70,"Address of %s = 0x%x, must be even!",local_d0,uVar6);
          warning_report(&pEVar1->location,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        if (uVar2 - 0x402 < 0xfffff800) {
          pEVar1 = s->expression;
          string_printf_abi_cxx11_
                    (&local_90,
                     "Interval between PC and target address: %+d (0x%x) - isn\'t codable in %d bit two\'s complement"
                     ,uVar6,uVar6,0xb);
          error_report(&pEVar1->location,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        uVar5 = (ushort)((int)(uVar2 - 2) >> 1);
      }
      else {
        string_printf_abi_cxx11_(&local_b0,"Label \"%s\" is defined in another section",local_d0);
        error_report(&pEVar1->location,&local_b0);
        uVar5 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
    }
    else {
      uVar5 = 0;
      if (pEVar1->type == ABSOLUTE) {
        uVar2 = pEVar1->value;
        if ((uVar2 & 1) != 0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Must be an even value!","");
          warning_report(&pEVar1->location,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        uVar5 = (ushort)(uVar2 >> 1);
      }
    }
    uVar5 = uVar5 & 0x3ff;
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,uVar5 | uVar7);
  return;
}

Assistant:

void Code_generator::visit(Inst_branch *s)
{
	s->check_alignment();
	auto code = 0U;
	switch (s->condition) {
	case EQ:
		code = BEQ_OPCODE;
		break;
	case NE:
		code = BNE_OPCODE;
		break;
	case CC:
       	case LO:
		code = BCC_OPCODE;
		break;
	case CS:
	case HS:
		code = BCS_OPCODE;
		break;
	case GE:
		code = BGE_OPCODE;
		break;
	case LT:
		code = BLT_OPCODE;
		break;
	case B:
		code = B_OPCODE;
		break;
	case BL:
		code = BL_OPCODE;
		break;
	}
	auto offset = 0;    //  o offset do branch é um valor com sinal
	if (s->expression->evaluate()) {
		auto exp_type = s->expression->get_type();
		if (exp_type == ABSOLUTE) {
			auto expression_value = s->expression->get_value();
			if ((expression_value & 1) != 0)
				warning_report(&s->expression->location, "Must be an even value!");
			offset = expression_value >> 1;
		}
		else if (exp_type == Value_type::LABEL) {
			string symbol = s->expression->get_symbol();
			if (s->section_index == Symbols::get_section(symbol)) { //  Label resolvida se pertencer à mesma secção
				offset = s->expression->get_value() - s->section_offset - 2;    //  O PC está dois endereços à frente
				if ((offset & 1) != 0)
					warning_report(&s->expression->location,
						string_printf("Address of %s = 0x%x, must be even!", symbol.c_str(), offset));
				if (offset >= (1 << BRANCH_OFFSET_SIZE) || offset < (~0 << BRANCH_OFFSET_SIZE))
					error_report(&s->expression->location,
						string_printf("Interval between PC and target address: %+d (0x%x) - "
								"isn't codable in %d bit two's complement",
								offset, offset, BRANCH_OFFSET_SIZE + 1));
				offset >>= 1;
			} else {    // A Label pertence a outra secção. Será resolvida na fase de relocalização
				error_report(&s->expression->location,
					string_printf( "Label \"%s\" is defined in another section", symbol.c_str()));
			}
		}
	}
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(code | ((offset & MAKE_MASK(BRANCH_OFFSET_SIZE, 0)) << BRANCH_OFFSET_POSITION)));
}